

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

void __thiscall LexerTest_LexKeywords_Test::TestBody(LexerTest_LexKeywords_Test *this)

{
  char *pcVar1;
  char *in_R9;
  pointer *__ptr;
  string_view buffer;
  undefined1 local_e0 [8];
  Lexer lexer;
  long local_78 [2];
  char local_68;
  AssertHelper local_60;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  internal local_28 [8];
  AssertionResult gtest_ar;
  
  local_68 = '\0';
  buffer._M_str = "module type func import rEsErVeD";
  buffer._M_len = 0x20;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_e0,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&lexer.buffer._M_str);
  if ((local_68 == '\x01') && (local_68 = '\0', (long *)lexer.buffer._M_str != local_78)) {
    operator_delete(lexer.buffer._M_str,local_78[0] + 1);
  }
  ::wasm::WATParser::Lexer::takeKeyword();
  local_38._M_len = 6;
  local_38._M_str = "module";
  testing::internal::
  CmpHelperEQ<std::optional<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
            (local_28,"lexer.takeKeyword()","\"module\"sv",
             (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_58._M_value,
             &local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58._M_value);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x3a8,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_38,(Message *)&local_58._M_value);
  }
  else {
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    ::wasm::WATParser::Lexer::takeKeyword();
    local_38._M_len = 4;
    local_38._M_str = "type";
    testing::internal::
    CmpHelperEQ<std::optional<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
              (local_28,"lexer.takeKeyword()","\"type\"sv",
               (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               &local_58._M_value,&local_38);
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58._M_value);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x3a9,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_38,(Message *)&local_58._M_value);
    }
    else {
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      ::wasm::WATParser::Lexer::takeKeyword();
      local_38._M_len = 4;
      local_38._M_str = "func";
      testing::internal::
      CmpHelperEQ<std::optional<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
                (local_28,"lexer.takeKeyword()","\"func\"sv",
                 (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &local_58._M_value,&local_38);
      if (local_28[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58._M_value);
        if (gtest_ar._0_8_ == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x3aa,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_38,(Message *)&local_58._M_value);
      }
      else {
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        ::wasm::WATParser::Lexer::takeKeyword();
        local_38._M_len = 6;
        local_38._M_str = "import";
        testing::internal::
        CmpHelperEQ<std::optional<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
                  (local_28,"lexer.takeKeyword()","\"import\"sv",
                   (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_58._M_value,&local_38);
        if (local_28[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58._M_value);
          if (gtest_ar._0_8_ == 0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x3ab,pcVar1);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_38,(Message *)&local_58._M_value);
        }
        else {
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          ::wasm::WATParser::Lexer::takeKeyword();
          local_38._M_len = 8;
          local_38._M_str = "rEsErVeD";
          testing::internal::
          CmpHelperEQ<std::optional<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
                    (local_28,"lexer.takeKeyword()","\"rEsErVeD\"sv",
                     (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &local_58._M_value,&local_38);
          if (local_28[0] != (internal)0x0) {
            if (gtest_ar._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar._0_8_);
            }
            local_28[0] = (internal)
                          (local_e0 ==
                          (undefined1  [8])
                          lexer.file.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._32_8_);
            gtest_ar.success_ = false;
            gtest_ar._1_7_ = 0;
            if (!(bool)local_28[0]) {
              testing::Message::Message((Message *)&local_38);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_58._M_value,local_28,(AssertionResult *)"lexer.empty()",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x3ad,(char *)local_58._M_value._M_len);
              testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_38);
              testing::internal::AssertHelper::~AssertHelper(&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_value._M_len != &local_48) {
                operator_delete((void *)local_58._M_value._M_len,local_48._M_allocated_capacity + 1)
                ;
              }
              if ((long *)local_38._M_len != (long *)0x0) {
                (**(code **)(*(long *)local_38._M_len + 8))();
              }
            }
            goto joined_r0x00233180;
          }
          testing::Message::Message((Message *)&local_58._M_value);
          if (gtest_ar._0_8_ == 0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x3ac,pcVar1);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_38,(Message *)&local_58._M_value);
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_value._M_len !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_58._M_value._M_len + 8))();
  }
joined_r0x00233180:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if ((lexer.file.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._24_1_ == '\x01') &&
     (lexer.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ = 0,
     lexer.annotations.
     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
     _M_impl.super__Vector_impl_data._M_end_of_storage !=
     (pointer)((long)&lexer.file.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 8U))) {
    operator_delete(lexer.annotations.
                    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    lexer.file.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length + 1);
  }
  if (lexer.pos != 0) {
    operator_delete((void *)lexer.pos,
                    (long)lexer.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_finish - lexer.pos);
  }
  return;
}

Assistant:

TEST(LexerTest, LexKeywords) {
  Lexer lexer("module type func import rEsErVeD");
  ASSERT_EQ(lexer.takeKeyword(), "module"sv);
  ASSERT_EQ(lexer.takeKeyword(), "type"sv);
  ASSERT_EQ(lexer.takeKeyword(), "func"sv);
  ASSERT_EQ(lexer.takeKeyword(), "import"sv);
  ASSERT_EQ(lexer.takeKeyword(), "rEsErVeD"sv);
  ASSERT_TRUE(lexer.empty());
}